

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,Ch *s,SizeType length,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Member *__dest;
  
  (this->data_).s.str = (Ch *)0x0;
  *(undefined8 *)((long)&this->data_ + 8) = 0;
  this->flags_ = 0;
  if (s != (Ch *)0x0) {
    if (length < 0x10) {
      this->flags_ = 0x700005;
      (this->data_).ss.str[0xf] = '\x0f' - (char)length;
      __dest = (Member *)this;
    }
    else {
      this->flags_ = 0x300005;
      (this->data_).s.length = length;
      __dest = (Member *)
               MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(allocator,(ulong)(length + 1));
      (this->data_).o.members = __dest;
    }
    memcpy(__dest,s,(ulong)length);
    *(undefined1 *)((long)&(__dest->name).data_ + (ulong)length) = 0;
    return;
  }
  __assert_fail("s != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/document.h"
                ,0x143,
                "rapidjson::GenericStringRef<char>::GenericStringRef(const CharType *, SizeType) [CharType = char]"
               );
}

Assistant:

GenericValue(const Ch* s, SizeType length, Allocator& allocator) : data_(), flags_() { SetStringRaw(StringRef(s, length), allocator); }